

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t>::CanStore
          (BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t> *this,
          idx_t data_bytes,idx_t meta_bytes)

{
  BlockManager *pBVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t iVar7;
  
  pBVar1 = (this->super_CompressionState).info.block_manager;
  iVar4 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar5 = optional_idx::GetIndex(&pBVar1->block_header_size);
  pdVar2 = this->metadata_ptr;
  pdVar3 = this->data_ptr;
  pBVar1 = (this->super_CompressionState).info.block_manager;
  iVar6 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar7 = optional_idx::GetIndex(&pBVar1->block_header_size);
  return pdVar3 + (((data_bytes + 7 & 0xfffffffffffffff8) + meta_bytes + iVar4) -
                  (long)(pdVar2 + iVar5)) <= (data_ptr_t)((iVar6 - iVar7) + -8);
}

Assistant:

bool CanStore(idx_t data_bytes, idx_t meta_bytes) {
		auto required_data_bytes = AlignValue<idx_t>(UnsafeNumericCast<idx_t>((data_ptr + data_bytes) - data_ptr));
		auto required_meta_bytes = info.GetBlockSize() - UnsafeNumericCast<idx_t>(metadata_ptr - data_ptr) + meta_bytes;

		return required_data_bytes + required_meta_bytes <=
		       info.GetBlockSize() - BitpackingPrimitives::BITPACKING_HEADER_SIZE;
	}